

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O1

void fe_loose_invert(fe *out,fe_loose *z)

{
  int iVar1;
  fe t2;
  fe t1;
  fe t3;
  fe t0;
  fe fStack_c8;
  fe local_a0;
  fe local_78;
  fe local_50;
  
  fe_sq_tl(&local_50,z);
  fe_sq_tt(&local_a0,&local_50);
  fe_sq_tt(&local_a0,&local_a0);
  fe_mul_impl(local_a0.v,z->v,local_a0.v);
  fe_mul_impl(local_50.v,local_50.v,local_a0.v);
  fe_sq_tt(&fStack_c8,&local_50);
  fe_mul_impl(local_a0.v,local_a0.v,fStack_c8.v);
  fe_sq_tt(&fStack_c8,&local_a0);
  iVar1 = 4;
  do {
    fe_sq_tt(&fStack_c8,&fStack_c8);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fe_mul_impl(local_a0.v,fStack_c8.v,local_a0.v);
  fe_sq_tt(&fStack_c8,&local_a0);
  iVar1 = 9;
  do {
    fe_sq_tt(&fStack_c8,&fStack_c8);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fe_mul_impl(fStack_c8.v,fStack_c8.v,local_a0.v);
  fe_sq_tt(&local_78,&fStack_c8);
  iVar1 = 0x13;
  do {
    fe_sq_tt(&local_78,&local_78);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fe_mul_impl(fStack_c8.v,local_78.v,fStack_c8.v);
  fe_sq_tt(&fStack_c8,&fStack_c8);
  iVar1 = 9;
  do {
    fe_sq_tt(&fStack_c8,&fStack_c8);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fe_mul_impl(local_a0.v,fStack_c8.v,local_a0.v);
  fe_sq_tt(&fStack_c8,&local_a0);
  iVar1 = 0x31;
  do {
    fe_sq_tt(&fStack_c8,&fStack_c8);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fe_mul_impl(fStack_c8.v,fStack_c8.v,local_a0.v);
  fe_sq_tt(&local_78,&fStack_c8);
  iVar1 = 99;
  do {
    fe_sq_tt(&local_78,&local_78);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fe_mul_impl(fStack_c8.v,local_78.v,fStack_c8.v);
  fe_sq_tt(&fStack_c8,&fStack_c8);
  iVar1 = 0x31;
  do {
    fe_sq_tt(&fStack_c8,&fStack_c8);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fe_mul_impl(local_a0.v,fStack_c8.v,local_a0.v);
  fe_sq_tt(&local_a0,&local_a0);
  iVar1 = 4;
  do {
    fe_sq_tt(&local_a0,&local_a0);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fe_mul_impl(out->v,local_a0.v,local_50.v);
  return;
}

Assistant:

static void fe_loose_invert(fe *out, const fe_loose *z) {
  fe t0;
  fe t1;
  fe t2;
  fe t3;
  int i;

  fe_sq_tl(&t0, z);
  fe_sq_tt(&t1, &t0);
  for (i = 1; i < 2; ++i) {
    fe_sq_tt(&t1, &t1);
  }
  fe_mul_tlt(&t1, z, &t1);
  fe_mul_ttt(&t0, &t0, &t1);
  fe_sq_tt(&t2, &t0);
  fe_mul_ttt(&t1, &t1, &t2);
  fe_sq_tt(&t2, &t1);
  for (i = 1; i < 5; ++i) {
    fe_sq_tt(&t2, &t2);
  }
  fe_mul_ttt(&t1, &t2, &t1);
  fe_sq_tt(&t2, &t1);
  for (i = 1; i < 10; ++i) {
    fe_sq_tt(&t2, &t2);
  }
  fe_mul_ttt(&t2, &t2, &t1);
  fe_sq_tt(&t3, &t2);
  for (i = 1; i < 20; ++i) {
    fe_sq_tt(&t3, &t3);
  }
  fe_mul_ttt(&t2, &t3, &t2);
  fe_sq_tt(&t2, &t2);
  for (i = 1; i < 10; ++i) {
    fe_sq_tt(&t2, &t2);
  }
  fe_mul_ttt(&t1, &t2, &t1);
  fe_sq_tt(&t2, &t1);
  for (i = 1; i < 50; ++i) {
    fe_sq_tt(&t2, &t2);
  }
  fe_mul_ttt(&t2, &t2, &t1);
  fe_sq_tt(&t3, &t2);
  for (i = 1; i < 100; ++i) {
    fe_sq_tt(&t3, &t3);
  }
  fe_mul_ttt(&t2, &t3, &t2);
  fe_sq_tt(&t2, &t2);
  for (i = 1; i < 50; ++i) {
    fe_sq_tt(&t2, &t2);
  }
  fe_mul_ttt(&t1, &t2, &t1);
  fe_sq_tt(&t1, &t1);
  for (i = 1; i < 5; ++i) {
    fe_sq_tt(&t1, &t1);
  }
  fe_mul_ttt(out, &t1, &t0);
}